

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall
spv::Builder::makeCompositeDebugType
          (Builder *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *memberTypes,char *name
          ,NonSemanticShaderDebugInfo100DebugCompositeType tag,bool isOpaqueType)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint *puVar3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  _Hash_node_base *p_Var6;
  iterator __position;
  pointer puVar7;
  char *__s;
  Id IVar8;
  __node_base_ptr p_Var9;
  mapped_type_conflict *pmVar10;
  mapped_type *debugTypeLoc;
  Instruction *pIVar11;
  long *plVar12;
  vector<spv::Instruction*,std::allocator<spv::Instruction*>> *this_00;
  size_type *psVar13;
  ulong uVar14;
  char cVar15;
  Id IVar16;
  undefined7 in_register_00000081;
  __node_base_ptr p_Var17;
  uint *puVar18;
  Id *pIVar19;
  size_type __n;
  Instruction *type;
  vector<unsigned_int,_std::allocator<unsigned_int>_> memberDebugTypes;
  uint memberType;
  Instruction *local_b8;
  allocator<char> local_a9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  NonSemanticShaderDebugInfo100DebugCompositeType local_88;
  undefined4 local_84;
  string local_80;
  char *local_60;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>,_std::allocator<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_58;
  Id local_50;
  undefined4 uStack_4c;
  long local_40 [2];
  
  local_84 = (undefined4)CONCAT71(in_register_00000081,isOpaqueType);
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (Id *)0x0;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (Id *)0x0;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  puVar18 = (memberTypes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar3 = (memberTypes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_88 = tag;
  local_60 = name;
  if (puVar18 != puVar3) {
    local_58 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>,_std::allocator<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->debugTypeLocs;
    do {
      uVar2 = *puVar18;
      local_80._M_dataplus._M_p._0_4_ = uVar2;
      uVar4 = (this->debugTypeLocs)._M_h._M_bucket_count;
      uVar14 = (ulong)uVar2 % uVar4;
      p_Var5 = (this->debugTypeLocs)._M_h._M_buckets[uVar14];
      p_Var9 = (__node_base_ptr)0x0;
      if ((p_Var5 != (__node_base_ptr)0x0) &&
         (p_Var9 = p_Var5, p_Var17 = p_Var5->_M_nxt, uVar2 != *(uint *)&p_Var5->_M_nxt[1]._M_nxt)) {
        while (p_Var6 = p_Var17->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
          p_Var9 = (__node_base_ptr)0x0;
          if (((ulong)*(uint *)&p_Var6[1]._M_nxt % uVar4 != uVar14) ||
             (p_Var9 = p_Var17, p_Var17 = p_Var6, uVar2 == *(uint *)&p_Var6[1]._M_nxt))
          goto LAB_0045965c;
        }
        p_Var9 = (__node_base_ptr)0x0;
      }
LAB_0045965c:
      if ((p_Var9 == (__node_base_ptr)0x0) || (p_Var9->_M_nxt == (_Hash_node_base *)0x0)) {
        __assert_fail("debugTypeLocs.find(memberType) != debugTypeLocs.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                      ,0x418,
                      "Id spv::Builder::makeCompositeDebugType(const std::vector<Id> &, const char *const, const NonSemanticShaderDebugInfo100DebugCompositeType, const bool)"
                     );
      }
      pmVar10 = std::
                map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                ::operator[](&this->debugId,(key_type_conflict *)&local_80);
      if (*pmVar10 != 0) {
        IVar8 = (uint)local_80._M_dataplus._M_p;
        debugTypeLoc = std::__detail::
                       _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>,_std::allocator<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[](local_58,(key_type *)&local_80);
        local_50 = makeMemberDebugType(this,IVar8,debugTypeLoc);
        if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_a8,
                     (iterator)
                     local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_50);
        }
        else {
          *local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = local_50;
          local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      puVar18 = puVar18 + 1;
    } while (puVar18 != puVar3);
  }
  pIVar11 = (Instruction *)operator_new(0x60);
  IVar16 = this->uniqueId + 1;
  this->uniqueId = IVar16;
  IVar8 = makeVoidType(this);
  pIVar11->_vptr_Instruction = (_func_int **)&PTR__Instruction_00b0d9f8;
  pIVar11->resultId = IVar16;
  pIVar11->typeId = IVar8;
  pIVar11->opCode = OpExtInst;
  (pIVar11->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (pIVar11->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (pIVar11->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar11->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar11->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pIVar11->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (pIVar11->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (pIVar11->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  pIVar11->block = (Block *)0x0;
  __n = ((long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start >> 2) + 0xb;
  local_b8 = pIVar11;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&pIVar11->operands,__n);
  std::vector<bool,_std::allocator<bool>_>::reserve(&pIVar11->idOperand,__n);
  Instruction::addIdOperand(local_b8,this->nonSemanticShaderDebugInfo);
  Instruction::addImmediateOperand(local_b8,10);
  __s = local_60;
  pIVar11 = local_b8;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,local_60,(allocator<char> *)&local_50);
  IVar8 = getStringId(this,&local_80);
  Instruction::addIdOperand(pIVar11,IVar8);
  paVar1 = &local_80.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  pIVar11 = local_b8;
  IVar8 = makeIntegerType(this,0x20,false);
  IVar8 = makeIntConstant(this,IVar8,local_88,false);
  Instruction::addIdOperand(pIVar11,IVar8);
  pIVar11 = local_b8;
  IVar8 = makeDebugSource(this,this->currentFileId);
  Instruction::addIdOperand(pIVar11,IVar8);
  pIVar11 = local_b8;
  uVar2 = this->currentLine;
  IVar8 = makeIntegerType(this,0x20,false);
  IVar8 = makeIntConstant(this,IVar8,uVar2,false);
  Instruction::addIdOperand(pIVar11,IVar8);
  pIVar11 = local_b8;
  IVar8 = makeIntegerType(this,0x20,false);
  IVar8 = makeIntConstant(this,IVar8,0,false);
  Instruction::addIdOperand(pIVar11,IVar8);
  pIVar11 = local_b8;
  IVar8 = makeDebugCompilationUnit(this);
  Instruction::addIdOperand(pIVar11,IVar8);
  pIVar11 = local_b8;
  cVar15 = (char)local_84;
  if (cVar15 == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,__s,(allocator<char> *)&local_50);
    IVar8 = getStringId(this,&local_80);
    Instruction::addIdOperand(pIVar11,IVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    pIVar11 = local_b8;
    IVar8 = makeIntegerType(this,0x20,false);
    IVar8 = makeIntConstant(this,IVar8,0,false);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_a9);
    plVar12 = (long *)std::__cxx11::string::insert((ulong)&local_50,0,'\x01');
    psVar13 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_80.field_2._M_allocated_capacity = *psVar13;
      local_80.field_2._8_8_ = plVar12[3];
      local_80._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_80.field_2._M_allocated_capacity = *psVar13;
      local_80._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_80._M_string_length = plVar12[1];
    *plVar12 = (long)psVar13;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    IVar8 = getStringId(this,&local_80);
    Instruction::addIdOperand(pIVar11,IVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(uStack_4c,local_50) != local_40) {
      operator_delete((long *)CONCAT44(uStack_4c,local_50),local_40[0] + 1);
    }
    pIVar11 = local_b8;
    IVar8 = makeDebugInfoNone(this);
  }
  Instruction::addIdOperand(pIVar11,IVar8);
  pIVar11 = local_b8;
  IVar8 = makeIntegerType(this,0x20,false);
  IVar8 = makeIntConstant(this,IVar8,3,false);
  Instruction::addIdOperand(pIVar11,IVar8);
  puVar7 = local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pIVar19 = local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((cVar15 != '\0') &&
     (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    __assert_fail("isOpaqueType == false || (isOpaqueType == true && memberDebugTypes.empty())",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0x437,
                  "Id spv::Builder::makeCompositeDebugType(const std::vector<Id> &, const char *const, const NonSemanticShaderDebugInfo100DebugCompositeType, const bool)"
                 );
  }
  for (; pIVar19 != puVar7; pIVar19 = pIVar19 + 1) {
    Instruction::addIdOperand(local_b8,*pIVar19);
  }
  local_80._M_dataplus._M_p._0_4_ = 10;
  this_00 = (vector<spv::Instruction*,std::allocator<spv::Instruction*>> *)
            std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->groupedDebugTypes,(key_type *)&local_80);
  __position._M_current = *(Instruction ***)(this_00 + 8);
  if (__position._M_current == *(Instruction ***)(this_00 + 0x10)) {
    std::vector<spv::Instruction*,std::allocator<spv::Instruction*>>::
    _M_realloc_insert<spv::Instruction*const&>(this_00,__position,&local_b8);
  }
  else {
    *__position._M_current = local_b8;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
  }
  local_80._M_dataplus._M_p = (pointer)local_b8;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&this->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_80);
  if ((Instruction *)local_80._M_dataplus._M_p != (Instruction *)0x0) {
    (**(code **)(*(long *)local_80._M_dataplus._M_p + 8))();
  }
  Module::mapInstruction(&this->module,local_b8);
  IVar8 = local_b8->resultId;
  if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (Id *)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return IVar8;
}

Assistant:

Id Builder::makeCompositeDebugType(std::vector<Id> const& memberTypes, char const*const name,
    NonSemanticShaderDebugInfo100DebugCompositeType const tag, bool const isOpaqueType)
{
    // Create the debug member types.
    std::vector<Id> memberDebugTypes;
    for(auto const memberType : memberTypes) {
        assert(debugTypeLocs.find(memberType) != debugTypeLocs.end());

        // There _should_ be debug types for all the member types but currently buffer references
        // do not have member debug info generated.
        if (debugId[memberType])
            memberDebugTypes.emplace_back(makeMemberDebugType(memberType, debugTypeLocs[memberType]));

        // TODO: Need to rethink this method of passing location information.
        // debugTypeLocs.erase(memberType);
    }

    // Create The structure debug type.
    Instruction* type = new Instruction(getUniqueId(), makeVoidType(), OpExtInst);
    type->reserveOperands(memberDebugTypes.size() + 11);
    type->addIdOperand(nonSemanticShaderDebugInfo);
    type->addImmediateOperand(NonSemanticShaderDebugInfo100DebugTypeComposite);
    type->addIdOperand(getStringId(name)); // name id
    type->addIdOperand(makeUintConstant(tag)); // tag id
    type->addIdOperand(makeDebugSource(currentFileId)); // source id
    type->addIdOperand(makeUintConstant(currentLine)); // line id TODO: currentLine always zero?
    type->addIdOperand(makeUintConstant(0)); // TODO: column id
    type->addIdOperand(makeDebugCompilationUnit()); // scope id
    if(isOpaqueType == true) {
        // Prepend '@' to opaque types.
        type->addIdOperand(getStringId('@' + std::string(name))); // linkage name id
        type->addIdOperand(makeDebugInfoNone()); // size id
    } else {
        type->addIdOperand(getStringId(name)); // linkage name id
        type->addIdOperand(makeUintConstant(0)); // TODO: size id
    }
    type->addIdOperand(makeUintConstant(NonSemanticShaderDebugInfo100FlagIsPublic)); // flags id
    assert(isOpaqueType == false || (isOpaqueType == true && memberDebugTypes.empty()));
    for(auto const memberDebugType : memberDebugTypes) {
        type->addIdOperand(memberDebugType);
    }

    groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeComposite].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}